

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrowPointingAt
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  ImVec2 *pos_00;
  int in_ESI;
  char *in_RDI;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  ImU32 col_00;
  ImVec2 in_stack_ffffffffffffffc0;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28 [5];
  
  col_00 = (ImU32)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  pos_00 = (ImVec2 *)(ulong)(in_ESI + 1);
  switch(pos_00) {
  case (ImVec2 *)0x0:
  case (ImVec2 *)0x5:
    break;
  case (ImVec2 *)0x1:
    ImVec2::ImVec2(local_28,in_XMM0_Da + in_XMM1_Da,in_XMM0_Db - in_XMM1_Db);
    ImDrawList::AddText((ImDrawList *)in_stack_ffffffffffffffc0,pos_00,
                        (ImU32)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0);
    break;
  case (ImVec2 *)0x2:
    ImVec2::ImVec2(&local_30,in_XMM0_Da + in_XMM1_Da,in_XMM0_Db - in_XMM1_Db);
    ImDrawList::AddText((ImDrawList *)in_stack_ffffffffffffffc0,pos_00,col_00,in_RDI,
                        in_stack_ffffffffffffffa0);
    break;
  case (ImVec2 *)0x3:
    ImVec2::ImVec2(&local_38,in_XMM0_Da + in_XMM1_Da,in_XMM0_Db - in_XMM1_Db);
    ImDrawList::AddText((ImDrawList *)in_stack_ffffffffffffffc0,pos_00,col_00,
                        in_stack_ffffffffffffffa8,in_RDI);
    break;
  case (ImVec2 *)0x4:
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,in_XMM0_Da + in_XMM1_Da,
                   in_XMM0_Db - in_XMM1_Db);
    ImDrawList::AddText((ImDrawList *)in_stack_ffffffffffffffc0,pos_00,col_00,
                        in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void ImGui::RenderArrowPointingAt(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    //case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    //case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    //case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    //case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Left:  draw_list->AddText(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), col, "<"); return;
    case ImGuiDir_Right: draw_list->AddText(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), col, ">"); return;
    case ImGuiDir_Up:    draw_list->AddText(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), col, "^"); return;
    case ImGuiDir_Down:  draw_list->AddText(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), col, "v"); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}